

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disp_repository.cpp
# Opt level: O1

void __thiscall
so_5::impl::disp_repository_t::install_exception_logger
          (disp_repository_t *this,event_exception_logger_unique_ptr_t *logger)

{
  event_exception_logger_t *peVar1;
  event_exception_logger_t *peVar2;
  int iVar3;
  pointer *__ptr;
  
  if ((logger->_M_t).
      super___uniq_ptr_impl<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
      ._M_t.
      super__Tuple_impl<0UL,_so_5::event_exception_logger_t_*,_std::default_delete<so_5::event_exception_logger_t>_>
      .super__Head_base<0UL,_so_5::event_exception_logger_t_*,_false>._M_head_impl !=
      (event_exception_logger_t *)0x0) {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_exception_logger_lock);
    if (iVar3 != 0) {
      std::__throw_system_error(iVar3);
    }
    peVar1 = (this->m_event_exception_logger)._M_t.
             super___uniq_ptr_impl<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_so_5::event_exception_logger_t_*,_std::default_delete<so_5::event_exception_logger_t>_>
             .super__Head_base<0UL,_so_5::event_exception_logger_t_*,_false>._M_head_impl;
    (this->m_event_exception_logger)._M_t.
    super___uniq_ptr_impl<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_so_5::event_exception_logger_t_*,_std::default_delete<so_5::event_exception_logger_t>_>
    .super__Head_base<0UL,_so_5::event_exception_logger_t_*,_false>._M_head_impl =
         (event_exception_logger_t *)0x0;
    (this->m_event_exception_logger)._M_t.
    super___uniq_ptr_impl<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_so_5::event_exception_logger_t_*,_std::default_delete<so_5::event_exception_logger_t>_>
    .super__Head_base<0UL,_so_5::event_exception_logger_t_*,_false>._M_head_impl =
         (logger->_M_t).
         super___uniq_ptr_impl<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
         ._M_t.
         super__Tuple_impl<0UL,_so_5::event_exception_logger_t_*,_std::default_delete<so_5::event_exception_logger_t>_>
         .super__Head_base<0UL,_so_5::event_exception_logger_t_*,_false>._M_head_impl;
    (logger->_M_t).
    super___uniq_ptr_impl<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_so_5::event_exception_logger_t_*,_std::default_delete<so_5::event_exception_logger_t>_>
    .super__Head_base<0UL,_so_5::event_exception_logger_t_*,_false>._M_head_impl =
         (event_exception_logger_t *)0x0;
    peVar2 = (this->m_event_exception_logger)._M_t.
             super___uniq_ptr_impl<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
             ._M_t.
             super__Tuple_impl<0UL,_so_5::event_exception_logger_t_*,_std::default_delete<so_5::event_exception_logger_t>_>
             .super__Head_base<0UL,_so_5::event_exception_logger_t_*,_false>._M_head_impl;
    (logger->_M_t).
    super___uniq_ptr_impl<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>
    ._M_t.
    super__Tuple_impl<0UL,_so_5::event_exception_logger_t_*,_std::default_delete<so_5::event_exception_logger_t>_>
    .super__Head_base<0UL,_so_5::event_exception_logger_t_*,_false>._M_head_impl =
         (event_exception_logger_t *)0x0;
    (*peVar2->_vptr_event_exception_logger_t[3])();
    if (peVar1 != (event_exception_logger_t *)0x0) {
      (*peVar1->_vptr_event_exception_logger_t[1])(peVar1);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_exception_logger_lock);
  }
  return;
}

Assistant:

void
disp_repository_t::install_exception_logger(
	event_exception_logger_unique_ptr_t logger )
{
	if( nullptr != logger.get() )
	{
		std::lock_guard< std::mutex > lock( m_exception_logger_lock );

		event_exception_logger_unique_ptr_t old_logger;
		old_logger.swap( m_event_exception_logger );
		m_event_exception_logger.swap( logger );

		m_event_exception_logger->on_install( std::move( logger ) );
	}
}